

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgba(int r,int g,int b,int a)

{
  nk_color nVar1;
  undefined4 local_4c;
  undefined1 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined1 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined1 local_24;
  undefined4 local_20;
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  nk_color ret;
  
  local_20 = r;
  if (0xfe < r) {
    local_20 = 0xff;
  }
  if (local_20 < 0) {
    local_24 = 0;
  }
  else {
    local_28 = r;
    if (0xfe < r) {
      local_28 = 0xff;
    }
    local_24 = (undefined1)local_28;
  }
  local_2c = g;
  if (0xfe < g) {
    local_2c = 0xff;
  }
  if (local_2c < 0) {
    local_30 = 0;
  }
  else {
    local_34 = g;
    if (0xfe < g) {
      local_34 = 0xff;
    }
    local_30 = (undefined1)local_34;
  }
  nVar1.g = local_30;
  nVar1.r = local_24;
  local_38 = b;
  if (0xfe < b) {
    local_38 = 0xff;
  }
  if (local_38 < 0) {
    local_3c = 0;
  }
  else {
    local_40 = b;
    if (0xfe < b) {
      local_40 = 0xff;
    }
    local_3c = (undefined1)local_40;
  }
  nVar1.b = local_3c;
  local_44 = a;
  if (0xfe < a) {
    local_44 = 0xff;
  }
  if (local_44 < 0) {
    local_48 = '\0';
  }
  else {
    local_4c = a;
    if (0xfe < a) {
      local_4c = 0xff;
    }
    local_48 = (nk_byte)local_4c;
  }
  nVar1.a = local_48;
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_rgba(int r, int g, int b, int a)
{
    struct nk_color ret;
    ret.r = (nk_byte)NK_CLAMP(0, r, 255);
    ret.g = (nk_byte)NK_CLAMP(0, g, 255);
    ret.b = (nk_byte)NK_CLAMP(0, b, 255);
    ret.a = (nk_byte)NK_CLAMP(0, a, 255);
    return ret;
}